

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O0

void absl::cord_internal::LogFatalNodeType(CordRep *rep)

{
  AlphaNum *in_RCX;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  int local_20 [2];
  char *local_18;
  char *absl_raw_log_internal_filename;
  CordRep *rep_local;
  
  local_18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.cc"
  ;
  local_20[1] = 3;
  local_20[0] = 0x24;
  absl_raw_log_internal_filename = (char *)rep;
  AlphaNum::AlphaNum(&local_70,"Unexpected node type: ");
  AlphaNum::AlphaNum(&local_a0,(uint)(byte)absl_raw_log_internal_filename[0xc]);
  StrCat_abi_cxx11_(&local_40,(absl *)&local_70,&local_a0,in_RCX);
  base_internal::AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
  ::operator()((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
               &local_18,local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.cc"
                ,0x24,"void absl::cord_internal::LogFatalNodeType(CordRep *)");
}

Assistant:

void LogFatalNodeType(CordRep* rep) {
  ABSL_INTERNAL_LOG(FATAL, absl::StrCat("Unexpected node type: ",
                                        static_cast<int>(rep->tag)));
}